

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionMeasurementModel.hpp
# Opt level: O0

void __thiscall
KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::updateJacobians
          (PositionMeasurementModel<float,_Kalman::StandardBase> *this,S *x)

{
  float fVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  ReturnType RVar4;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  undefined4 extraout_XMM0_Db_00;
  double dVar6;
  float d2;
  float d1;
  Vector<float,2> local_78 [8];
  Vector<float,_2> delta2;
  Vector<float,2> local_58 [8];
  Vector<float,_2> delta1;
  Vector<float,2> local_20 [8];
  Vector<float,_2> position;
  S *x_local;
  PositionMeasurementModel<float,_Kalman::StandardBase> *this_local;
  
  position.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array = (Matrix<float,_2,_1>)(Matrix<float,_2,_1>)x;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_> *)
             &(this->
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              ).H);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::head<2>
            ((Type *)&delta1,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             position.super_Matrix<float,_2,_1>.
             super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array,2);
  Kalman::Vector<float,2>::Vector<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>const,2,1,false>>
            (local_20,(MatrixBase<Eigen::Block<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_2,_1,_false>_>
                       *)&delta1);
  Eigen::MatrixBase<Eigen::Matrix<float,2,1,0,2,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
              *)&delta2,(MatrixBase<Eigen::Matrix<float,2,1,0,2,1>> *)local_20,
             (MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&this->landmark1);
  Kalman::Vector<float,2>::
  Vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,2,1,0,2,1>const,Eigen::Matrix<float,2,1,0,2,1>const>>
            (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       *)&delta2);
  Eigen::MatrixBase<Eigen::Matrix<float,2,1,0,2,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
              *)&d2,(MatrixBase<Eigen::Matrix<float,2,1,0,2,1>> *)local_20,
             (MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&this->landmark2);
  Kalman::Vector<float,2>::
  Vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,2,1,0,2,1>const,Eigen::Matrix<float,2,1,0,2,1>const>>
            (local_78,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       *)&d2);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<float,2,1,0,2,1>>::dot<Eigen::Matrix<float,2,1,0,2,1>>
                    ((MatrixBase<Eigen::Matrix<float,2,1,0,2,1>> *)local_58,
                     (MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_58);
  dVar5 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,RVar4));
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<float,2,1,0,2,1>>::dot<Eigen::Matrix<float,2,1,0,2,1>>
                    ((MatrixBase<Eigen::Matrix<float,2,1,0,2,1>> *)local_78,
                     (MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_78);
  dVar6 = std::sqrt((double)CONCAT44(extraout_XMM0_Db_00,RVar4));
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)local_58,0);
  fVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1> *)
                      &(this->
                       super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                       ).H,0,0);
  *pSVar3 = fVar1 / SUB84(dVar5,0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)local_58,1);
  fVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1> *)
                      &(this->
                       super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                       ).H,0,1);
  *pSVar3 = fVar1 / SUB84(dVar5,0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)local_78,0);
  fVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1> *)
                      &(this->
                       super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                       ).H,1,0);
  *pSVar3 = fVar1 / SUB84(dVar6,0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_1> *)local_78,1);
  fVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_1> *)
                      &(this->
                       super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                       ).H,1,1);
  *pSVar3 = fVar1 / SUB84(dVar6,0);
  return;
}

Assistant:

void updateJacobians( const S& x )
    {
        // H = dh/dx (Jacobian of measurement function w.r.t. the state)
        this->H.setZero();
        
        // Robot position as (x,y)-vector
        // This uses the Eigen template method to get the first 2 elements of the vector
        Kalman::Vector<T, 2> position = x.template head<2>();
        
        // Distance of robot to landmark 1
        Kalman::Vector<T, 2> delta1 = position - landmark1;
        
        // Distance of robot to landmark 2
        Kalman::Vector<T, 2> delta2 = position - landmark2;
        
        // Distances
        T d1 = std::sqrt( delta1.dot(delta1) );
        T d2 = std::sqrt( delta2.dot(delta2) );
        
        // partial derivative of meas.d1() w.r.t. x.x()
        this->H( M::D1, S::X ) = delta1[0] / d1;
        // partial derivative of meas.d1() w.r.t. x.y()
        this->H( M::D1, S::Y ) = delta1[1] / d1;
        
        // partial derivative of meas.d1() w.r.t. x.x()
        this->H( M::D2, S::X ) = delta2[0] / d2;
        // partial derivative of meas.d1() w.r.t. x.y()
        this->H( M::D2, S::Y ) = delta2[1] / d2;
    }